

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O3

StatT * __thiscall MyGame::Example::Stat::UnPack(Stat *this,resolver_function_t *_resolver)

{
  uint16_t uVar1;
  StatT *this_00;
  long lVar2;
  unsigned_short vtsize;
  ushort uVar3;
  ulong uVar4;
  int64_t iVar5;
  pointer *__ptr;
  long *local_40 [2];
  long local_30 [2];
  
  this_00 = (StatT *)operator_new(0x30);
  this_00->val = 0;
  *(undefined8 *)&this_00->count = 0;
  (this_00->id).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->id).field_2 + 8) = 0;
  (this_00->id)._M_dataplus._M_p = (pointer)&(this_00->id).field_2;
  (this_00->id)._M_string_length = 0;
  this_00->val = 0;
  uVar3 = *(ushort *)(this + -(long)*(int *)this);
  if (uVar3 < 5) {
LAB_00179594:
    this_00->val = 0;
  }
  else {
    lVar2 = -(long)*(int *)this;
    uVar4 = (ulong)*(ushort *)(this + lVar2 + 4);
    if (uVar4 != 0) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,this + *(uint *)(this + uVar4) + uVar4 + 4,
                 this + (ulong)*(uint *)(this + *(uint *)(this + uVar4) + uVar4) +
                        *(uint *)(this + uVar4) + uVar4 + 4);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_40);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
      lVar2 = -(long)*(int *)this;
      uVar3 = *(ushort *)(this + -(long)*(int *)this);
    }
    if (uVar3 < 7) goto LAB_00179594;
    if ((ulong)*(ushort *)(this + lVar2 + 6) == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int64_t *)(this + *(ushort *)(this + lVar2 + 6));
    }
    this_00->val = iVar5;
    if ((8 < uVar3) && ((ulong)*(ushort *)(this + lVar2 + 8) != 0)) {
      uVar1 = *(uint16_t *)(this + *(ushort *)(this + lVar2 + 8));
      goto LAB_0017959e;
    }
  }
  uVar1 = 0;
LAB_0017959e:
  this_00->count = uVar1;
  return this_00;
}

Assistant:

inline StatT *Stat::UnPack(const ::flatbuffers::resolver_function_t *_resolver) const {
  auto _o = std::unique_ptr<StatT>(new StatT());
  UnPackTo(_o.get(), _resolver);
  return _o.release();
}